

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int commission_handshake_secret(ptls_t *tls)

{
  int iVar1;
  uint is_enc_00;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *local_20;
  int is_enc;
  ptls_t *tls_local;
  
  iVar1 = ptls_is_server(tls);
  is_enc_00 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  if (tls->pending_handshake_secret != (uint8_t *)0x0) {
    if (is_enc_00 == 0) {
      local_20 = &tls->traffic_protection;
    }
    else {
      local_20 = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)&(tls->traffic_protection).enc
      ;
    }
    memcpy(local_20,tls->pending_handshake_secret,0x40);
    (*ptls_clear_memory)(tls->pending_handshake_secret,0x40);
    free(tls->pending_handshake_secret);
    tls->pending_handshake_secret = (uint8_t *)0x0;
    iVar1 = setup_traffic_protection(tls,is_enc_00,(char *)0x0,2,1);
    return iVar1;
  }
  __assert_fail("tls->pending_handshake_secret != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c",
                0x498,"int commission_handshake_secret(ptls_t *)");
}

Assistant:

static int commission_handshake_secret(ptls_t *tls)
{
    int is_enc = !ptls_is_server(tls);

    assert(tls->pending_handshake_secret != NULL);
    memcpy((is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec)->secret, tls->pending_handshake_secret,
           PTLS_MAX_DIGEST_SIZE);
    ptls_clear_memory(tls->pending_handshake_secret, PTLS_MAX_DIGEST_SIZE);
    free(tls->pending_handshake_secret);
    tls->pending_handshake_secret = NULL;

    return setup_traffic_protection(tls, is_enc, NULL, 2, 1);
}